

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O2

string * brynet::net::WebSocketFormat::wsHandshake(string *__return_storage_ptr__,string *secKey)

{
  allocator<char> local_119;
  string base64Str;
  uchar puDest [20];
  CSHA1 s1;
  
  std::__cxx11::string::append((char *)secKey);
  CSHA1::CSHA1(&s1);
  CSHA1::Update(&s1,(uchar *)(secKey->_M_dataplus)._M_p,(uint)secKey->_M_string_length);
  CSHA1::Final(&s1);
  CSHA1::GetHash(&s1,puDest);
  base64_encode_abi_cxx11_(&base64Str,puDest,0x14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
             ,&local_119);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&base64Str);
  CSHA1::~CSHA1(&s1);
  return __return_storage_ptr__;
}

Assistant:

static std::string wsHandshake(std::string secKey)
            {
                secKey.append("258EAFA5-E914-47DA-95CA-C5AB0DC85B11");

                CSHA1 s1;
                s1.Update((unsigned char*)secKey.c_str(), static_cast<unsigned int>(secKey.size()));
                s1.Final();
                unsigned char puDest[20];
                s1.GetHash(puDest);

                std::string base64Str = base64_encode((const unsigned char *)puDest, 20);

                std::string response = "HTTP/1.1 101 Switching Protocols\r\n"
                    "Upgrade: websocket\r\n"
                    "Connection: Upgrade\r\n"
                    "Sec-WebSocket-Accept: ";

                response += base64Str;
                response += "\r\n\r\n";

                return response;
            }